

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O1

bool bssl::anon_unknown_20::VerifyHash(EVP_MD *type,Input hash,Input value)

{
  bool bVar1;
  int iVar2;
  Input rhs;
  uint value_hash_len;
  uint8_t value_hash [64];
  uint local_5c;
  uchar local_58 [64];
  
  bVar1 = false;
  iVar2 = EVP_Digest(value.data_.data_,value.data_.size_,local_58,&local_5c,(EVP_MD *)type,
                     (ENGINE *)0x0);
  if (iVar2 != 0) {
    rhs.data_.size_._0_4_ = local_5c;
    rhs.data_.data_ = local_58;
    rhs.data_.size_._4_4_ = 0;
    bVar1 = bssl::der::operator==(hash,rhs);
  }
  return bVar1;
}

Assistant:

bool VerifyHash(const EVP_MD *type, der::Input hash, der::Input value) {
  unsigned value_hash_len;
  uint8_t value_hash[EVP_MAX_MD_SIZE];
  if (!EVP_Digest(value.data(), value.size(), value_hash, &value_hash_len, type,
                  nullptr)) {
    return false;
  }

  return hash == der::Input(value_hash, value_hash_len);
}